

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

handle pybind11::detail::
       list_caster<std::vector<unsigned_short,std::allocator<unsigned_short>>,unsigned_short>::
       cast<std::vector<unsigned_short,std::allocator<unsigned_short>>>
                 (vector<unsigned_short,_std::allocator<unsigned_short>_> *src,
                 return_value_policy policy,handle parent)

{
  bool bVar1;
  PyObject **ppPVar2;
  undefined8 in_RDX;
  return_value_policy in_SIL;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_RDI;
  object value_;
  unsigned_short *value;
  iterator __end0;
  iterator __begin0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range3;
  size_t index;
  list l;
  handle in_stack_ffffffffffffff48;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  *in_stack_ffffffffffffff50;
  handle in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff68;
  list *in_stack_ffffffffffffff70;
  handle local_88;
  uint local_7c;
  undefined8 local_78;
  PyObject *local_60;
  handle local_58;
  reference local_50;
  unsigned_short *local_48;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_40;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_38;
  long local_30;
  handle local_28;
  return_value_policy local_19;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_18;
  undefined8 local_10;
  handle local_8;
  
  local_18 = in_RDI;
  local_10 = in_RDX;
  local_19 = return_value_policy_override<unsigned_short,_void>::policy(in_SIL);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(local_18);
  list::list(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_30 = 0;
  local_38 = local_18;
  local_40._M_current =
       (unsigned_short *)
       std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                 ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                  in_stack_ffffffffffffff48.m_ptr);
  local_48 = (unsigned_short *)
             std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                        in_stack_ffffffffffffff48.m_ptr);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff50,
                       (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                        *)in_stack_ffffffffffffff48.m_ptr);
    if (!bVar1) break;
    local_50 = __gnu_cxx::
               __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
               ::operator*(&local_40);
    forward_like<std::vector<unsigned_short,std::allocator<unsigned_short>>,unsigned_short&>
              (local_50);
    local_78 = local_10;
    local_60 = (PyObject *)
               type_caster<unsigned_short,_void>::cast<unsigned_short>
                         (0,automatic,in_stack_ffffffffffffff48);
    reinterpret_steal<pybind11::object>(in_stack_ffffffffffffff58);
    bVar1 = pybind11::handle::operator_cast_to_bool(&local_58);
    if (bVar1) {
      local_88 = object::release(in_stack_ffffffffffffff48.m_ptr);
      ppPVar2 = pybind11::handle::ptr(&local_88);
      in_stack_ffffffffffffff58.m_ptr = *ppPVar2;
      ppPVar2 = pybind11::handle::ptr(&local_28);
      (&(((*ppPVar2)[1].ob_type)->ob_base).ob_base.ob_refcnt)[local_30] =
           (Py_ssize_t)in_stack_ffffffffffffff58.m_ptr;
      local_30 = local_30 + 1;
    }
    else {
      memset(&local_8,0,8);
      pybind11::handle::handle(&local_8);
    }
    local_7c = (uint)!bVar1;
    object::~object((object *)0x3c4e32);
    if (local_7c != 0) goto LAB_003c4e90;
    __gnu_cxx::
    __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator++(&local_40);
  }
  local_8 = object::release(in_stack_ffffffffffffff48.m_ptr);
  local_7c = 1;
LAB_003c4e90:
  list::~list((list *)0x3c4e9d);
  return (handle)local_8.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        size_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), (ssize_t) index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }